

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCSwitchfinder.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  char cVar2;
  size_t sVar3;
  istream *piVar4;
  string reference;
  string line;
  ifstream input;
  allocator local_2f1;
  locale local_2f0 [8];
  string local_2e8;
  char *local_2c8;
  char *local_2c0;
  char local_2b8 [16];
  string local_2a8;
  string local_288;
  undefined1 *local_268 [2];
  undefined1 local_258 [16];
  iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  long local_238 [65];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Starting ",9);
  pcVar1 = argv[1];
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10e160);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  std::__cxx11::string::string((string *)local_268,argv[3],&local_2f1);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  local_2e8._M_string_length = 0;
  local_2e8.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream((istream *)local_238,(string *)local_268,_S_in);
  local_2c0 = (char *)0x0;
  local_2b8[0] = '\0';
  local_2c8 = local_2b8;
  while( true ) {
    cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_2c8,cVar2);
    if (*(int *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18) + 0x20) != 0) break;
    if ((local_2c0 != (char *)0x0) && (*local_2c8 != '>')) {
      std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_2c8);
      std::__cxx11::string::_M_replace((ulong)&local_2c8,0,local_2c0,0x10a0b0);
    }
  }
  std::locale::locale(local_2f0);
  local_248.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_current = local_2e8._M_dataplus._M_p + local_2e8._M_string_length;
  local_248.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_current = local_2e8._M_dataplus._M_p;
  boost::algorithm::detail::
  transform_range<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::algorithm::detail::to_upperF<char>>
            (&local_248,local_2f0);
  std::locale::~locale(local_2f0);
  if (local_2c8 != local_2b8) {
    operator_delete(local_2c8);
  }
  std::ifstream::~ifstream(local_238);
  if (local_268[0] != local_258) {
    operator_delete(local_268[0]);
  }
  std::__cxx11::string::string((string *)&local_288,argv[1],(allocator *)local_238);
  std::__cxx11::string::string((string *)&local_2a8,argv[2],(allocator *)&local_2c8);
  findSwitches(&local_288,&local_2a8,&local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ended",5);
  pcVar1 = argv[1];
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10e160);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
   
    cout << "Starting "<< argv[1] << endl;
    string reference = readReferenceFile(argv[3]);
    findSwitches(argv[1],argv[2],reference);
    //scoreIndividualReads();
    cout << "Ended"<< argv[1] << endl;


}